

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNDeparture<unsigned_char>::CATNDeparture
          (CATNDeparture<unsigned_char> *this,CharClass<unsigned_char> *label,ATNPath *path,
          int color,PriorityChain *priority)

{
  PriorityChain *priority_local;
  int color_local;
  ATNPath *path_local;
  CharClass<unsigned_char> *label_local;
  CATNDeparture<unsigned_char> *this_local;
  
  CharClass<unsigned_char>::CharClass(&this->m_label,label);
  ATNPath::ATNPath(&this->m_path,path);
  this->m_color = color;
  PriorityChain::PriorityChain(&this->m_priority,priority);
  return;
}

Assistant:

CATNDeparture(const CharClass<TCHAR>& label, const ATNPath& path, int color, const PriorityChain& priority)
        : m_label(label), m_path(path), m_color(color), m_priority(priority)
    {
    }